

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O2

float If_CutAreaFlow(If_Man_t *p,If_Cut_t *pCut)

{
  float fVar1;
  If_Obj_t *pIVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  
  fVar4 = If_CutLutArea(p,pCut);
  uVar3 = 0;
  while( true ) {
    if ((byte)pCut->field_0x1f <= uVar3) {
      return fVar4;
    }
    pIVar2 = If_ManObj(p,(int)(&pCut[1].Area)[uVar3]);
    if (pIVar2 == (If_Obj_t *)0x0) break;
    if ((pIVar2->nRefs == 0) ||
       (((undefined1  [112])*pIVar2 & (undefined1  [112])0xf) == (undefined1  [112])0x1)) {
      fVar5 = (pIVar2->CutBest).Area;
    }
    else {
      fVar5 = pIVar2->EstRefs;
      if (fVar5 < p->fEpsilon || fVar5 == p->fEpsilon) {
        __assert_fail("pLeaf->EstRefs > p->fEpsilon",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                      ,0x3a3,"float If_CutAreaFlow(If_Man_t *, If_Cut_t *)");
      }
      fVar5 = (pIVar2->CutBest).Area / fVar5;
    }
    fVar1 = 1e+32;
    if (((fVar4 < 1e+32) && (fVar1 = 1e+32, fVar5 < 1e+32)) &&
       (fVar1 = fVar4 + fVar5, 1e+32 < fVar4 + fVar5)) {
      fVar1 = 1e+32;
    }
    fVar4 = fVar1;
    uVar3 = uVar3 + 1;
  }
  return fVar4;
}

Assistant:

float If_CutAreaFlow( If_Man_t * p, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    float Flow, AddOn;
    int i;
    Flow = If_CutLutArea(p, pCut);
    If_CutForEachLeaf( p, pCut, pLeaf, i )
    {
        if ( pLeaf->nRefs == 0 || If_ObjIsConst1(pLeaf) )
            AddOn = If_ObjCutBest(pLeaf)->Area;
        else 
        {
            assert( pLeaf->EstRefs > p->fEpsilon );
            AddOn = If_ObjCutBest(pLeaf)->Area / pLeaf->EstRefs;
        }
        if ( Flow >= (float)1e32 || AddOn >= (float)1e32 )
            Flow = (float)1e32;
        else 
        {
            Flow += AddOn;
            if ( Flow > (float)1e32 )
                 Flow = (float)1e32;
        }
    }
    return Flow;
}